

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

char * SHA384_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_f0 [8];
  SHA384_CTX context;
  char *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._120_8_ = digest;
  SHA384_Init((SHA512_CTX *)local_f0);
  SHA384_Update((SHA512_CTX *)local_f0,data,len);
  pcVar1 = SHA384_End((SHA384_CTX *)local_f0,(char *)context.buffer._120_8_);
  return pcVar1;
}

Assistant:

char* SHA384_Data(const sha2_byte* data, size_t len, char digest[SHA384_DIGEST_STRING_LENGTH]) {
	SHA384_CTX	context;

	SHA384_Init(&context);
	SHA384_Update(&context, data, len);
	return SHA384_End(&context, digest);
}